

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O2

int delmatchlines(int f,int n)

{
  int iVar1;
  
  iVar1 = re_readpattern("Flush lines (containing match for regexp)");
  if (iVar1 == 1) {
    iVar1 = killmatches(1);
    return iVar1;
  }
  return iVar1;
}

Assistant:

int
delmatchlines(int f, int n)
{
	int	s;

	if ((s = re_readpattern("Flush lines (containing match for regexp)"))
	    != TRUE)
		return (s);

	s = killmatches(TRUE);
	return (s);
}